

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_WriteObjectRec(BCWriterState *s,JSValue obj)

{
  DynBuf *pDVar1;
  ushort *puVar2;
  byte bVar3;
  uint uVar4;
  JSContext *ctx;
  void *pvVar5;
  JSMapRecord *pJVar6;
  long lVar7;
  JSObjectListEntry *pJVar8;
  JSProperty *__src;
  JSRuntime *pJVar9;
  BCWriterState *pBVar10;
  uint8_t uVar11;
  ushort uVar12;
  int iVar13;
  uint8_t *data;
  ushort uVar14;
  int iVar15;
  size_t size;
  uintptr_t sp;
  uint uVar16;
  JSValueUnion obj_00;
  uint32_t v;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  JSValue obj_01;
  JSValue obj_02;
  JSValue obj_03;
  JSValue obj_04;
  JSValue obj_05;
  JSValue obj_06;
  JSValueUnion local_50;
  DynBuf *local_48;
  JSValueUnion local_40;
  BCWriterState *local_38;
  
  obj_02.tag = obj.tag;
  obj_00 = obj.u;
  ctx = s->ctx;
  local_40 = obj_00;
  if (&stack0xfffffffffffffff8 < (undefined1 *)ctx->rt->stack_limit) {
    JS_ThrowInternalError(ctx,"stack overflow");
    return -1;
  }
  local_38 = s;
  switch((int)obj.tag) {
  case 0:
    dbuf_putc(&s->dbuf,'\x05');
    dbuf_put_leb128(&s->dbuf,(int)local_40._0_4_ >> 0x1f ^ local_40._0_4_ * 2);
    return 0;
  case 1:
    local_40._0_1_ = obj.u._0_1_;
    uVar11 = local_40._0_1_ + '\x03';
    goto LAB_0012d447;
  case 2:
    uVar11 = '\x01';
    goto LAB_0012d447;
  case 3:
    uVar11 = '\x02';
LAB_0012d447:
    dbuf_putc(&s->dbuf,uVar11);
    return 0;
  case 7:
    dbuf_putc(&s->dbuf,'\x06');
    local_50 = obj_00;
    if (s->field_0x38 != '\0') {
      local_50.ptr = (void *)((ulong)obj_00.ptr >> 0x38 |
                              ((ulong)obj_00.ptr & 0xff000000000000) >> 0x28 |
                              ((ulong)obj_00.ptr & 0xff0000000000) >> 0x18 |
                              ((ulong)obj_00.ptr & 0xff00000000) >> 8 |
                              ((ulong)obj_00.ptr & 0xff000000) << 8 |
                              ((ulong)obj_00.ptr & 0xff0000) << 0x18 |
                              ((ulong)obj_00.ptr & 0xff00) << 0x28 | (long)obj_00.ptr << 0x38);
    }
    dbuf_put(&s->dbuf,(uint8_t *)&local_50.int32,8);
    return 0;
  case -7:
    dbuf_putc(&s->dbuf,'\a');
    JS_WriteString(s,(JSString *)obj_00.ptr);
    return 0;
  case -3:
    if (s->field_0x39 != '\0') {
      pDVar1 = &s->dbuf;
      dbuf_putc(pDVar1,'\x0f');
      bc_put_atom(s,*(JSAtom *)((long)obj_00.ptr + 4));
      local_48 = pDVar1;
      dbuf_put_leb128(pDVar1,*(uint32_t *)((long)obj_00.ptr + 0x20));
      if (0 < *(int *)((long)obj_00.ptr + 0x20)) {
        lVar17 = 0;
        lVar20 = 0;
        do {
          bc_put_atom(s,*(JSAtom *)
                         ((long)&((*(JSShape **)((long)obj_00.ptr + 0x18))->header).ref_count +
                         lVar17));
          lVar20 = lVar20 + 1;
          lVar17 = lVar17 + 0x10;
        } while (lVar20 < *(int *)((long)obj_00.ptr + 0x20));
      }
      dbuf_put_leb128(local_48,*(uint32_t *)((long)obj_00.ptr + 0x30));
      pDVar1 = local_48;
      if (0 < *(int *)((long)obj_00.ptr + 0x30)) {
        lVar17 = 0x18;
        lVar20 = 0;
        do {
          pJVar6 = *(JSMapRecord **)((long)obj_00.ptr + 0x28);
          dbuf_putc(pDVar1,*(uint8_t *)((long)pJVar6 + lVar17 + -8));
          iVar13 = *(int *)((long)pJVar6 + lVar17 + -8);
          dbuf_put_leb128(pDVar1,*(uint32_t *)((long)pJVar6 + lVar17 + -0x18));
          pBVar10 = local_38;
          if (iVar13 != 0) {
            bc_put_atom(local_38,*(JSAtom *)((long)pJVar6 + lVar17 + -4));
          }
          bc_put_atom(pBVar10,*(JSAtom *)((long)&pJVar6->ref_count + lVar17));
          lVar20 = lVar20 + 1;
          lVar17 = lVar17 + 0x20;
        } while (lVar20 < *(int *)((long)obj_00.ptr + 0x30));
      }
      pDVar1 = local_48;
      dbuf_put_leb128(local_48,*(uint32_t *)((long)obj_00.ptr + 0x40));
      if (0 < *(int *)((long)obj_00.ptr + 0x40)) {
        lVar17 = 0;
        do {
          dbuf_put_leb128(pDVar1,*(uint32_t *)(*(long *)((long)obj_00.ptr + 0x38) + lVar17 * 4));
          lVar17 = lVar17 + 1;
        } while (lVar17 < *(int *)((long)obj_00.ptr + 0x40));
      }
      dbuf_put_leb128(pDVar1,*(uint32_t *)((long)obj_00.ptr + 0x50));
      if (0 < *(int *)((long)obj_00.ptr + 0x50)) {
        lVar17 = 8;
        lVar20 = 0;
        do {
          lVar7 = *(long *)&((JSObject *)((long)obj_00.ptr + 0x48))->field_0;
          dbuf_put_leb128(pDVar1,*(uint32_t *)(lVar7 + -8 + lVar17));
          bc_put_atom(local_38,*(JSAtom *)(lVar7 + -4 + lVar17));
          dbuf_put_leb128(pDVar1,*(uint32_t *)(lVar7 + lVar17));
          lVar20 = lVar20 + 1;
          lVar17 = lVar17 + 0xc;
        } while (lVar20 < *(int *)((long)obj_00.ptr + 0x50));
      }
      iVar13 = JS_WriteObjectRec(local_38,*(JSValue *)((long)obj_00.ptr + 0x68));
      if (iVar13 == 0) {
        return 0;
      }
      return -1;
    }
    break;
  case -2:
    if (s->field_0x39 != '\0') {
      pDVar1 = &s->dbuf;
      dbuf_putc(pDVar1,'\x0e');
      uVar12 = *(ushort *)((long)obj_00.ptr + 0x19) & 0xfff;
      uVar14 = uVar12 << 8 | uVar12 >> 8;
      if (s->field_0x38 == '\0') {
        uVar14 = uVar12;
      }
      local_50.int32._0_2_ = uVar14;
      dbuf_put(pDVar1,(uint8_t *)&local_50.int32,2);
      dbuf_putc(pDVar1,*(uint8_t *)((long)obj_00.ptr + 0x18));
      bc_put_atom(s,*(JSAtom *)((long)obj_00.ptr + 0x2c));
      dbuf_put_leb128(pDVar1,(uint)*(ushort *)((long)obj_00.ptr + 0x40));
      dbuf_put_leb128(pDVar1,(uint)*(ushort *)((long)obj_00.ptr + 0x42));
      dbuf_put_leb128(pDVar1,(uint)*(ushort *)((long)obj_00.ptr + 0x44));
      dbuf_put_leb128(pDVar1,(uint)*(ushort *)((long)obj_00.ptr + 0x46));
      dbuf_put_leb128(pDVar1,*(uint32_t *)((long)obj_00.ptr + 0x5c));
      dbuf_put_leb128(pDVar1,*(uint32_t *)((long)obj_00.ptr + 0x58));
      dbuf_put_leb128(pDVar1,*(uint32_t *)((long)obj_00.ptr + 0x28));
      if (((anon_union_24_22_bbf4f0e3_for_u *)((long)obj_00.ptr + 0x30))->opaque == (void *)0x0) {
        dbuf_putc(pDVar1,'\0');
      }
      else {
        dbuf_put_leb128(pDVar1,(uint)*(ushort *)((long)obj_00.ptr + 0x42) +
                               (uint)*(ushort *)((long)obj_00.ptr + 0x40));
        if (*(short *)((long)obj_00.ptr + 0x42) != 0 || *(short *)((long)obj_00.ptr + 0x40) != 0) {
          lVar17 = 0xc;
          uVar19 = 0;
          do {
            pvVar5 = ((anon_union_24_22_bbf4f0e3_for_u *)((long)obj_00.ptr + 0x30))->opaque;
            bc_put_atom(s,*(JSAtom *)((long)pvVar5 + lVar17 + -0xc));
            dbuf_put_leb128(pDVar1,*(uint32_t *)((long)pvVar5 + lVar17 + -8));
            dbuf_put_leb128(pDVar1,*(int *)((long)pvVar5 + lVar17 + -4) + 1);
            dbuf_putc(pDVar1,(byte)((*(uint *)((long)pvVar5 + lVar17) & 7) << 4) |
                             (byte)(*(uint *)((long)pvVar5 + lVar17) >> 3) & 0xf);
            uVar19 = uVar19 + 1;
            lVar17 = lVar17 + 0x10;
          } while (uVar19 < (ulong)*(ushort *)((long)obj_00.ptr + 0x42) +
                            (ulong)*(ushort *)((long)obj_00.ptr + 0x40));
        }
      }
      if (0 < *(int *)((long)obj_00.ptr + 0x5c)) {
        lVar17 = 0;
        do {
          lVar20 = *(long *)((long)obj_00.ptr + 0x38);
          bc_put_atom(s,*(JSAtom *)(lVar20 + 4 + lVar17 * 8));
          dbuf_put_leb128(pDVar1,(uint)*(ushort *)(lVar20 + 2 + lVar17 * 8));
          dbuf_putc(pDVar1,*(uint8_t *)(lVar20 + lVar17 * 8));
          lVar17 = lVar17 + 1;
        } while (lVar17 < *(int *)((long)obj_00.ptr + 0x5c));
      }
      __src = *(JSProperty **)((long)obj_00.ptr + 0x20);
      iVar13 = *(int *)((long)obj_00.ptr + 0x28);
      size = (size_t)iVar13;
      data = (uint8_t *)js_malloc(s->ctx,size);
      if (data == (uint8_t *)0x0) {
        return -1;
      }
      memcpy(data,__src,size);
      if (0 < iVar13) {
        uVar18 = 0;
        do {
          bVar3 = data[uVar18];
          uVar4 = bVar3 + 0xf;
          if (bVar3 < 0xb2) {
            uVar4 = (uint)bVar3;
          }
          uVar16 = (uint)opcode_info[uVar4].size;
          if ((byte)(opcode_info[uVar4].fmt - 0x17) < 5) {
            local_48 = (DynBuf *)CONCAT44(local_48._4_4_,(uint)opcode_info[uVar4].size);
            iVar15 = bc_atom_to_idx(s,(uint32_t *)&local_50.int32,
                                    *(JSAtom *)(data + (ulong)uVar18 + 1));
            if (iVar15 != 0) {
              pJVar9 = s->ctx->rt;
              (*(pJVar9->mf).js_free)(&pJVar9->malloc_state,data);
              return -1;
            }
            *(int32_t *)(data + (ulong)uVar18 + 1) = local_50.int32;
            uVar16 = (uint)local_48;
          }
          uVar18 = uVar18 + uVar16;
        } while ((int)uVar18 < iVar13);
      }
      if ((0 < iVar13) && (s->field_0x38 != '\0')) {
        uVar18 = 0;
        do {
          bVar3 = data[uVar18];
          uVar4 = bVar3 + 0xf;
          if (bVar3 < 0xb2) {
            uVar4 = (uint)bVar3;
          }
          bVar3 = opcode_info[uVar4].size;
          uVar11 = opcode_info[uVar4].fmt;
          switch(uVar11) {
          case '\n':
          case '\v':
          case '\f':
          case '\r':
          case '\x10':
          case '\x11':
          case '\x12':
            puVar2 = (ushort *)(data + (ulong)uVar18 + 1);
            *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
            break;
          case '\x0f':
            puVar2 = (ushort *)(data + (ulong)uVar18 + 1);
            *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
            puVar2 = (ushort *)(data + (ulong)uVar18 + 3);
            *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
            break;
          case '\x13':
          case '\x14':
          case '\x15':
          case '\x16':
          case '\x17':
          case '\x18':
            uVar4 = *(uint *)(data + (ulong)uVar18 + 1);
            *(uint *)(data + (ulong)uVar18 + 1) =
                 uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
            break;
          case '\x19':
          case '\x1c':
            uVar4 = *(uint *)(data + (ulong)uVar18 + 1);
            *(uint *)(data + (ulong)uVar18 + 1) =
                 uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
            puVar2 = (ushort *)(data + (ulong)uVar18 + 5);
            *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
            break;
          case '\x1a':
          case '\x1b':
            uVar4 = *(uint *)(data + (ulong)uVar18 + 1);
            uVar16 = *(uint *)(data + (ulong)uVar18 + 5);
            *(uint *)(data + (ulong)uVar18 + 1) =
                 uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
            *(uint *)(data + (ulong)uVar18 + 5) =
                 uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18
            ;
            if (uVar11 == '\x1b') {
              puVar2 = (ushort *)(data + (ulong)uVar18 + 9);
              *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
            }
          }
          uVar18 = uVar18 + bVar3;
        } while ((int)uVar18 < iVar13);
      }
      dbuf_put(pDVar1,data,size);
      pJVar9 = s->ctx->rt;
      (*(pJVar9->mf).js_free)(&pJVar9->malloc_state,data);
      if ((*(byte *)((long)obj_00.ptr + 0x1a) & 4) != 0) {
        bc_put_atom(s,*(JSAtom *)((long)obj_00.ptr + 0x60));
        dbuf_put_leb128(pDVar1,*(uint32_t *)((long)obj_00.ptr + 100));
        dbuf_put_leb128(pDVar1,*(uint32_t *)((long)obj_00.ptr + 0x6c));
        dbuf_put(pDVar1,(uint8_t *)*(JSMapRecord **)((long)obj_00.ptr + 0x70),
                 (long)*(int *)((long)obj_00.ptr + 0x6c));
      }
      if (0 < *(int *)((long)obj_00.ptr + 0x58)) {
        lVar20 = 8;
        lVar17 = 0;
        do {
          obj_01.tag = *(int64_t *)(*(long *)((long)obj_00.ptr + 0x50) + lVar20);
          obj_01.u.ptr = ((JSValueUnion *)(*(long *)((long)obj_00.ptr + 0x50) + -8 + lVar20))->ptr;
          iVar13 = JS_WriteObjectRec(s,obj_01);
          if (iVar13 != 0) {
            return -1;
          }
          lVar17 = lVar17 + 1;
          lVar20 = lVar20 + 0x10;
        } while (lVar17 < *(int *)((long)obj_00.ptr + 0x58));
        return 0;
      }
      return 0;
    }
    break;
  case -1:
    if (0xffffff < *(uint *)&s->field_0x38) {
      if (((s->object_list).object_count != 0) &&
         (v = (s->object_list).hash_table[obj.u._0_4_ * 0xc5b & (s->object_list).hash_size - 1],
         v != 0xffffffff)) {
        pJVar8 = (s->object_list).object_tab;
        do {
          if (pJVar8[v].obj == (JSObject *)obj_00.ptr) goto LAB_0012d529;
          v = pJVar8[v].hash_next;
        } while (v != 0xffffffff);
      }
      v = 0xffffffff;
LAB_0012d529:
      if ((int)v < 0) {
        iVar13 = js_object_list_add(ctx,&s->object_list,(JSObject *)obj_00.ptr);
        iVar15 = 4;
        if (iVar13 == 0) goto LAB_0012d7de;
      }
      else {
        dbuf_putc(&s->dbuf,'\x15');
        dbuf_put_leb128(&s->dbuf,v);
        iVar15 = 2;
      }
      goto LAB_0012d855;
    }
    if ((*(byte *)((long)obj_00.ptr + 5) & 0x40) != 0) {
      JS_ThrowTypeError(ctx,"circular reference");
      iVar15 = 4;
      goto LAB_0012d855;
    }
    *(byte *)((long)obj_00.ptr + 5) = *(byte *)((long)obj_00.ptr + 5) | 0x40;
LAB_0012d7de:
    pBVar10 = local_38;
    obj_06.tag = &switchD_0012d7fd::switchdataD_0017c100;
    switch(*(short *)((long)obj_00.ptr + 6)) {
    case 1:
      obj_05.tag = (int64_t)&switchD_0012d7fd::switchdataD_0017c100;
      obj_05.u.float64 = local_40.float64;
      iVar13 = JS_WriteObjectTag(local_38,obj_05);
      break;
    case 2:
      obj_02.u.float64 = local_40.float64;
      iVar13 = JS_WriteArray(local_38,obj_02);
      break;
    default:
      if ((ushort)(*(short *)((long)obj_00.ptr + 6) - 0x15U) < 9) {
        obj_06.u.float64 = local_40.float64;
        iVar13 = JS_WriteTypedArray(local_38,obj_06);
      }
      else {
        JS_ThrowTypeError(local_38->ctx,"unsupported object class");
        iVar13 = -1;
      }
      break;
    case 4:
    case 5:
    case 6:
      uVar11 = '\x14';
      goto LAB_0012d831;
    case 10:
      uVar11 = '\x13';
LAB_0012d831:
      dbuf_putc(&local_38->dbuf,uVar11);
      iVar13 = JS_WriteObjectRec(pBVar10,*(JSValue *)((long)obj_00.ptr + 0x30));
      break;
    case 0x13:
      obj_03.tag = (int64_t)&switchD_0012d7fd::switchdataD_0017c100;
      obj_03.u.float64 = local_40.float64;
      iVar13 = JS_WriteArrayBuffer(local_38,obj_03);
      break;
    case 0x14:
      if (local_38->field_0x3a == '\0') {
        iVar15 = 3;
        goto LAB_0012d855;
      }
      obj_04.tag = (int64_t)&switchD_0012d7fd::switchdataD_0017c100;
      obj_04.u.float64 = local_40.float64;
      iVar13 = JS_WriteSharedArrayBuffer(local_38,obj_04);
    }
    *(byte *)((long)obj_00.ptr + 5) = *(byte *)((long)obj_00.ptr + 5) & 0xbf;
    iVar15 = (uint)(iVar13 != 0) << 2;
LAB_0012d855:
    if (iVar15 == 4) {
      return -1;
    }
    if (iVar15 != 3) {
      return 0;
    }
  }
  JS_ThrowInternalError(local_38->ctx,"unsupported tag (%d)",obj_02.tag & 0xffffffff);
  return -1;
}

Assistant:

static int JS_WriteObjectRec(BCWriterState *s, JSValueConst obj)
{
    uint32_t tag;

    if (js_check_stack_overflow(s->ctx->rt, 0)) {
        JS_ThrowStackOverflow(s->ctx);
        return -1;
    }

    tag = JS_VALUE_GET_NORM_TAG(obj);
    switch(tag) {
    case JS_TAG_NULL:
        bc_put_u8(s, BC_TAG_NULL);
        break;
    case JS_TAG_UNDEFINED:
        bc_put_u8(s, BC_TAG_UNDEFINED);
        break;
    case JS_TAG_BOOL:
        bc_put_u8(s, BC_TAG_BOOL_FALSE + JS_VALUE_GET_INT(obj));
        break;
    case JS_TAG_INT:
        bc_put_u8(s, BC_TAG_INT32);
        bc_put_sleb128(s, JS_VALUE_GET_INT(obj));
        break;
    case JS_TAG_FLOAT64:
        {
            JSFloat64Union u;
            bc_put_u8(s, BC_TAG_FLOAT64);
            u.d = JS_VALUE_GET_FLOAT64(obj);
            bc_put_u64(s, u.u64);
        }
        break;
    case JS_TAG_STRING:
        {
            JSString *p = JS_VALUE_GET_STRING(obj);
            bc_put_u8(s, BC_TAG_STRING);
            JS_WriteString(s, p);
        }
        break;
    case JS_TAG_FUNCTION_BYTECODE:
        if (!s->allow_bytecode)
            goto invalid_tag;
        if (JS_WriteFunctionTag(s, obj))
            goto fail;
        break;
    case JS_TAG_MODULE:
        if (!s->allow_bytecode)
            goto invalid_tag;
        if (JS_WriteModule(s, obj))
            goto fail;
        break;
    case JS_TAG_OBJECT:
        {
            JSObject *p = JS_VALUE_GET_OBJ(obj);
            int ret, idx;
            
            if (s->allow_reference) {
                idx = js_object_list_find(s->ctx, &s->object_list, p);
                if (idx >= 0) {
                    bc_put_u8(s, BC_TAG_OBJECT_REFERENCE);
                    bc_put_leb128(s, idx);
                    break;
                } else {
                    if (js_object_list_add(s->ctx, &s->object_list, p))
                        goto fail;
                }
            } else {
                if (p->tmp_mark) {
                    JS_ThrowTypeError(s->ctx, "circular reference");
                    goto fail;
                }
                p->tmp_mark = 1;
            }
            switch(p->class_id) {
            case JS_CLASS_ARRAY:
                ret = JS_WriteArray(s, obj);
                break;
            case JS_CLASS_OBJECT:
                ret = JS_WriteObjectTag(s, obj);
                break;
            case JS_CLASS_ARRAY_BUFFER:
                ret = JS_WriteArrayBuffer(s, obj);
                break;
            case JS_CLASS_SHARED_ARRAY_BUFFER:
                if (!s->allow_sab)
                    goto invalid_tag;
                ret = JS_WriteSharedArrayBuffer(s, obj);
                break;
            case JS_CLASS_DATE:
                bc_put_u8(s, BC_TAG_DATE);
                ret = JS_WriteObjectRec(s, p->u.object_data);
                break;
            case JS_CLASS_NUMBER:
            case JS_CLASS_STRING:
            case JS_CLASS_BOOLEAN:
#ifdef CONFIG_BIGNUM
            case JS_CLASS_BIG_INT:
            case JS_CLASS_BIG_FLOAT:
            case JS_CLASS_BIG_DECIMAL:
#endif
                bc_put_u8(s, BC_TAG_OBJECT_VALUE);
                ret = JS_WriteObjectRec(s, p->u.object_data);
                break;
            default:
                if (p->class_id >= JS_CLASS_UINT8C_ARRAY &&
                    p->class_id <= JS_CLASS_FLOAT64_ARRAY) {
                    ret = JS_WriteTypedArray(s, obj);
                } else {
                    JS_ThrowTypeError(s->ctx, "unsupported object class");
                    ret = -1;
                }
                break;
            }
            p->tmp_mark = 0;
            if (ret)
                goto fail;
        }
        break;
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_INT:
    case JS_TAG_BIG_FLOAT:
    case JS_TAG_BIG_DECIMAL:
        if (JS_WriteBigNum(s, obj))
            goto fail;
        break;
#endif
    default:
    invalid_tag:
        JS_ThrowInternalError(s->ctx, "unsupported tag (%d)", tag);
        goto fail;
    }
    return 0;

 fail:
    return -1;
}